

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  long lVar1;
  sqlite3 *db;
  RenameToken *pRVar2;
  byte *__src;
  RenameCtx *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  char *z;
  char *pcVar9;
  int iVar10;
  RenameCtx *pRVar11;
  uint uVar12;
  RenameToken *pBest;
  RenameToken *p;
  char *local_98;
  ulong local_88;
  char *local_68;
  char *local_60;
  
  local_88 = 0;
  uVar4 = 0;
  if (zNew != (char *)0x0) {
    sVar8 = strlen(zNew);
    uVar4 = (uint)sVar8 & 0x3fffffff;
  }
  if (zSql != (char *)0x0) {
    sVar8 = strlen(zSql);
    local_88 = (ulong)((uint)sVar8 & 0x3fffffff);
  }
  db = pCtx->pOut->db;
  if (zNew == (char *)0x0) {
    lVar1 = local_88 * 2 + 1;
    z = (char *)sqlite3DbMallocZero(db,lVar1 * 3);
    iVar5 = 0;
    if (z == (char *)0x0) {
      iVar5 = 7;
      local_98 = (char *)0x0;
      goto LAB_001a3742;
    }
    local_60 = z + lVar1;
    local_68 = z + local_88 * 4 + 2;
    local_98 = (char *)0x0;
  }
  else {
    local_98 = sqlite3MPrintf(db,"\"%w\" ",zNew);
    if (local_98 == (char *)0x0) {
      return 7;
    }
    sVar8 = strlen(local_98);
    iVar5 = ((uint)sVar8 & 0x3fffffff) - 1;
    z = (char *)sqlite3DbMallocZero(db,local_88 + (long)pRename->nList * (long)iVar5 + 1);
    if (z == (char *)0x0) {
      iVar5 = 7;
      goto LAB_001a3742;
    }
    local_68 = (char *)0x0;
    local_60 = (char *)0x0;
  }
  memcpy(z,zSql,local_88);
  p = pRename->pList;
  if (p != (RenameToken *)0x0) {
    iVar6 = (int)local_88;
    do {
      for (pRVar2 = p->pNext; pRVar3 = pRename, pRVar2 != (RenameToken *)0x0; pRVar2 = pRVar2->pNext
          ) {
        if ((p->t).z < (pRVar2->t).z) {
          p = pRVar2;
        }
      }
      do {
        pRVar11 = pRVar3;
        pRVar2 = pRVar11->pList;
        pRVar3 = (RenameCtx *)&pRVar2->pNext;
      } while (pRVar2 != p);
      pRVar11->pList = p->pNext;
      __src = (byte *)(p->t).z;
      if (zNew == (char *)0x0) {
        memcpy(local_60,__src,(ulong)(p->t).n);
        local_60[(p->t).n] = '\0';
        sqlite3Dequote(local_60);
        pcVar9 = "";
        if ((p->t).z[(p->t).n] == '\'') {
          pcVar9 = " ";
        }
        uVar12 = 0;
        sqlite3_snprintf(iVar6 * 2,local_68,"%Q%s",local_60,pcVar9);
        if (local_68 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar8 = strlen(local_68);
          uVar12 = (uint)sVar8 & 0x3fffffff;
          pcVar9 = local_68;
        }
      }
      else if ((bQuote != 0) || (pcVar9 = zNew, uVar12 = uVar4, (""[*__src] & 0x46) == 0)) {
        pcVar9 = local_98;
        uVar12 = (uint)(__src[(p->t).n] == 0x22) + iVar5;
      }
      iVar10 = (int)(p->t).z - (int)zSql;
      uVar7 = (p->t).n;
      if (uVar7 != uVar12) {
        uVar7 = uVar7 + iVar10;
        memmove(z + (uVar12 + iVar10),z + uVar7,(ulong)((int)local_88 - uVar7));
        uVar7 = (int)local_88 + (uVar12 - (p->t).n);
        local_88 = (ulong)uVar7;
        z[(int)uVar7] = '\0';
      }
      memcpy(z + iVar10,pcVar9,(ulong)uVar12);
      sqlite3DbFreeNN(db,p);
      p = pRename->pList;
    } while (p != (RenameToken *)0x0);
  }
  setResultStrOrError(pCtx,z,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  sqlite3DbFreeNN(db,z);
  iVar5 = 0;
LAB_001a3742:
  sqlite3_free(local_98);
  return iVar5;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  i64 nNew = sqlite3Strlen30(zNew);
  i64 nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot = 0;
  char *zOut;
  i64 nQuot = 0;
  char *zBuf1 = 0;
  char *zBuf2 = 0;

  if( zNew ){
    /* Set zQuot to point to a buffer containing a quoted copy of the
    ** identifier zNew. If the corresponding identifier in the original
    ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
    ** point to zQuot so that all substitutions are made using the
    ** quoted version of the new column name.  */
    zQuot = sqlite3MPrintf(db, "\"%w\" ", zNew);
    if( zQuot==0 ){
      return SQLITE_NOMEM;
    }else{
      nQuot = sqlite3Strlen30(zQuot)-1;
    }

    assert( nQuot>=nNew );
    zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  }else{
    zOut = (char*)sqlite3DbMallocZero(db, (nSql*2+1) * 3);
    if( zOut ){
      zBuf1 = &zOut[nSql*2+1];
      zBuf2 = &zOut[nSql*4+2];
    }
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name, or with single-quoted versions of themselves.
  ** All that remains is to construct and return the edited SQL string. */
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      u32 nReplace;
      const char *zReplace;
      RenameToken *pBest = renameColumnTokenNext(pRename);

      if( zNew ){
        if( bQuote==0 && sqlite3IsIdChar(*pBest->t.z) ){
          nReplace = nNew;
          zReplace = zNew;
        }else{
          nReplace = nQuot;
          zReplace = zQuot;
          if( pBest->t.z[pBest->t.n]=='"' ) nReplace++;
        }
      }else{
        /* Dequote the double-quoted token. Then requote it again, this time
        ** using single quotes. If the character immediately following the
        ** original token within the input SQL was a single quote ('), then
        ** add another space after the new, single-quoted version of the
        ** token. This is so that (SELECT "string"'alias') maps to
        ** (SELECT 'string' 'alias'), and not (SELECT 'string''alias').  */
        memcpy(zBuf1, pBest->t.z, pBest->t.n);
        zBuf1[pBest->t.n] = 0;
        sqlite3Dequote(zBuf1);
        sqlite3_snprintf(nSql*2, zBuf2, "%Q%s", zBuf1,
            pBest->t.z[pBest->t.n]=='\'' ? " " : ""
        );
        zReplace = zBuf2;
        nReplace = sqlite3Strlen30(zReplace);
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n],
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}